

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cm_transport.c
# Opt level: O1

int find_transport_in_cm(CManager cm,char *trans_name)

{
  transport_entry_conflict p_Var1;
  int iVar2;
  transport_entry_conflict *pp_Var3;
  
  pp_Var3 = cm->transports;
  if (pp_Var3 != (transport_entry_conflict *)0x0) {
    p_Var1 = *pp_Var3;
    while (p_Var1 != (transport_entry_conflict)0x0) {
      pp_Var3 = pp_Var3 + 1;
      iVar2 = strcmp(p_Var1->trans_name,trans_name);
      if (iVar2 == 0) {
        return 1;
      }
      p_Var1 = *pp_Var3;
    }
  }
  return 0;
}

Assistant:

int
find_transport_in_cm(CManager cm, const char *trans_name)
{
    int i = 0;
    if (cm->transports == NULL)
	return 0;
    while (cm->transports[i] != NULL) {
	if (strcmp(cm->transports[i]->trans_name, trans_name) == 0)
	    return 1;
	i++;
    }
    return 0;
}